

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int VmExtractCallback(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  uint uVar1;
  jx9_vm *pVm;
  jx9_value *pDest;
  sxu32 nLen;
  uint uVar2;
  SyString local_40;
  
  uVar2 = *(uint *)((long)pUserData + 0x1c);
  if (((uVar2 & 0x10) != 0) && ((pKey->iFlags & 0xe) != 0)) {
    uVar2 = uVar2 | 8;
  }
  pVm = *pUserData;
  jx9MemObjToString(pKey);
  uVar1 = (pKey->sBlob).nByte;
  if (uVar1 == 0) {
    return 0;
  }
  local_40.nByte = 0;
  if (((uVar2 & 8) == 0) || ((int)*(uint *)((long)pUserData + 0x18) < 1)) {
    nLen = 0x400;
    if (uVar1 < 0x400) {
      nLen = uVar1;
    }
    local_40.nByte = SyMemcpy((pKey->sBlob).pBlob,(void *)((long)pUserData + 0x20),nLen);
  }
  else {
    local_40.nByte =
         SyBufferFormat((char *)((long)pUserData + 0x20),0x400,"%.*s_%.*s",
                        (ulong)*(uint *)((long)pUserData + 0x18),
                        *(undefined8 *)((long)pUserData + 0x10),(ulong)uVar1,(pKey->sBlob).pBlob);
  }
  local_40.zString = (char *)((long)pUserData + 0x20);
  pDest = VmExtractMemObj(pVm,&local_40,1,0);
  if (pDest != (jx9_value *)0x0) {
    if ((uVar2 & 2) != 0) {
      return 0;
    }
    if ((uVar2 & 4) == 0) goto LAB_0012dbb5;
    if ((uVar2 & 8) != 0) {
      return 0;
    }
    if ((int)*(uint *)((long)pUserData + 0x18) < 1) {
      return 0;
    }
    local_40.nByte =
         SyBufferFormat((char *)((long)pUserData + 0x20),0x400,"%.*s_%.*s",
                        (ulong)*(uint *)((long)pUserData + 0x18),
                        *(undefined8 *)((long)pUserData + 0x10),(ulong)(pKey->sBlob).nByte,
                        (pKey->sBlob).pBlob);
  }
  pDest = VmExtractMemObj(pVm,&local_40,1,1);
LAB_0012dbb5:
  if (pDest != (jx9_value *)0x0) {
    jx9MemObjStore(pValue,pDest);
    *(int *)((long)pUserData + 8) = *(int *)((long)pUserData + 8) + 1;
  }
  return 0;
}

Assistant:

static int VmExtractCallback(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	extract_aux_data *pAux = (extract_aux_data *)pUserData;
	int iFlags = pAux->iFlags;
	jx9_vm *pVm = pAux->pVm;
	jx9_value *pObj;
	SyString sVar;
	if( (iFlags & 0x10/* EXTR_PREFIX_INVALID */) && (pKey->iFlags & (MEMOBJ_INT|MEMOBJ_BOOL|MEMOBJ_REAL))){
		iFlags |= 0x08; /*EXTR_PREFIX_ALL*/
	}
	/* Perform a string cast */
	jx9MemObjToString(pKey);
	if( SyBlobLength(&pKey->sBlob) < 1 ){
		/* Unavailable variable name */
		return SXRET_OK;
	}
	sVar.nByte = 0; /* cc warning */
	if( (iFlags & 0x08/*EXTR_PREFIX_ALL*/ ) && pAux->Prefixlen > 0 ){
		sVar.nByte = (sxu32)SyBufferFormat(pAux->zWorker, sizeof(pAux->zWorker), "%.*s_%.*s", 
			pAux->Prefixlen, pAux->zPrefix, 
			SyBlobLength(&pKey->sBlob), SyBlobData(&pKey->sBlob)
			);
	}else{
		sVar.nByte = (sxu32) SyMemcpy(SyBlobData(&pKey->sBlob), pAux->zWorker, 
			SXMIN(SyBlobLength(&pKey->sBlob), sizeof(pAux->zWorker)));
	}
	sVar.zString = pAux->zWorker;
	/* Try to extract the variable */
	pObj = VmExtractMemObj(pVm, &sVar, TRUE, FALSE);
	if( pObj ){
		/* Collision */
		if( iFlags & 0x02 /* EXTR_SKIP */ ){
			return SXRET_OK;
		}
		if( iFlags & 0x04 /* EXTR_PREFIX_SAME */ ){
			if( (iFlags & 0x08/*EXTR_PREFIX_ALL*/) || pAux->Prefixlen < 1){
				/* Already prefixed */
				return SXRET_OK;
			}
			sVar.nByte = SyBufferFormat(
				pAux->zWorker, sizeof(pAux->zWorker),
				"%.*s_%.*s", 
				pAux->Prefixlen, pAux->zPrefix, 
				SyBlobLength(&pKey->sBlob), SyBlobData(&pKey->sBlob)
				);
			pObj = VmExtractMemObj(pVm, &sVar, TRUE, TRUE);
		}
	}else{
		/* Create the variable */
		pObj = VmExtractMemObj(pVm, &sVar, TRUE, TRUE);
	}
	if( pObj ){
		/* Overwrite the old value */
		jx9MemObjStore(pValue, pObj);
		/* Increment counter */
		pAux->iCount++;
	}
	return SXRET_OK;
}